

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O3

bool P_Scroll3dMidtex(sector_t *sector,int crush,double move,bool ceiling)

{
  extsector_t *peVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  
  peVar1 = sector->e;
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 5);
  uVar8 = (ulong)*(uint *)((long)&(peVar1->Midtex).Floor.AttachedLines.Count + uVar7);
  uVar7 = uVar7 | 0x10;
  if (uVar8 != 0) {
    lVar2 = *(long *)((long)&(peVar1->Midtex).Floor.AttachedSectors.Array + uVar7);
    uVar6 = 0;
    do {
      lVar3 = *(long *)(lVar2 + uVar6 * 8);
      lVar4 = *(long *)(lVar3 + 0x48);
      *(double *)(lVar4 + 0x48) = *(double *)(lVar4 + 0x48) + move;
      lVar3 = *(long *)(lVar3 + 0x50);
      *(double *)(lVar3 + 0x48) = *(double *)(lVar3 + 0x48) + move;
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  if (*(int *)((long)&(peVar1->FakeFloor).Sectors.Count + uVar7) == 0) {
    bVar5 = true;
  }
  else {
    uVar8 = 0;
    bVar9 = 0;
    do {
      bVar5 = P_ChangeSector(*(sector_t **)
                              (*(long *)((long)&(peVar1->FakeFloor).Sectors.Array + uVar7) +
                              uVar8 * 8),crush,move,2,true);
      bVar9 = bVar9 | bVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 < *(uint *)((long)&(peVar1->FakeFloor).Sectors.Count + uVar7));
    bVar5 = (bool)(bVar9 ^ 1);
  }
  return bVar5;
}

Assistant:

bool P_Scroll3dMidtex(sector_t *sector, int crush, double move, bool ceiling)
{
	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// First step: Change all lines' texture offsets
	for(unsigned i = 0; i < scrollplane.AttachedLines.Size(); i++)
	{
		line_t *l = scrollplane.AttachedLines[i];

		l->sidedef[0]->AddTextureYOffset(side_t::mid, move);
		l->sidedef[1]->AddTextureYOffset(side_t::mid, move);
	}

	// Second step: Check all sectors whether the move is ok.
	bool res = false;

	for(unsigned i = 0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		res |= P_ChangeSector(scrollplane.AttachedSectors[i], crush, move, 2, true);
	}
	return !res;
}